

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# min_sum.cpp
# Opt level: O1

int si9ma::MinSum::merge(int *arr,int L,int M,int R)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  size_t __n;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  undefined8 uStack_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  void *local_40;
  int local_34;
  
  iVar8 = M + 1;
  local_58 = (ulong)(uint)(R - L);
  local_50 = (ulong)((R - L) + 1);
  lVar4 = -(local_50 * 4 + 0xf & 0xfffffffffffffff0);
  local_40 = (void *)((long)&local_58 + lVar4);
  uVar9 = 0;
  iVar6 = L;
  if (M < R && L <= M) {
    uVar9 = 0;
    iVar11 = 0;
    do {
      iVar2 = arr[iVar6];
      iVar3 = arr[iVar8];
      iVar10 = ((R + 1) - iVar8) * iVar2;
      iVar5 = iVar3;
      if (iVar2 < iVar3) {
        iVar5 = iVar2;
      }
      if (iVar3 <= iVar2) {
        iVar10 = 0;
      }
      iVar11 = iVar10 + iVar11;
      iVar8 = (uint)(iVar3 <= iVar2) + iVar8;
      iVar6 = iVar6 + (uint)(iVar2 < iVar3);
      *(int *)((long)local_40 + uVar9 * 4) = iVar5;
      uVar9 = uVar9 + 1;
    } while ((iVar6 <= M) && (iVar8 <= R));
  }
  else {
    iVar11 = 0;
  }
  local_34 = L;
  if (iVar6 <= M) {
    pvVar1 = (void *)((long)local_40 + (uVar9 & 0xffffffff) * 4);
    local_48 = (ulong)(uint)R;
    *(undefined8 *)((long)&uStack_60 + lVar4) = 0x1029ee;
    memcpy(pvVar1,arr + iVar6,(ulong)(uint)(M - iVar6) * 4 + 4);
    R = (int)local_48;
    uVar9 = (ulong)((int)uVar9 + (M - iVar6) + 1);
  }
  if (iVar8 <= R) {
    pvVar1 = (void *)((long)local_40 + (uVar9 & 0xffffffff) * 4);
    *(undefined8 *)((long)&uStack_60 + lVar4) = 0x102a1c;
    memcpy(pvVar1,arr + iVar8,(ulong)(uint)(R - iVar8) * 4 + 4);
  }
  pvVar1 = local_40;
  if (-1 < (int)local_58) {
    lVar7 = (long)local_34;
    __n = local_50 << 2;
    *(undefined8 *)((long)&uStack_60 + lVar4) = 0x102a3b;
    memcpy(arr + lVar7,pvVar1,__n);
  }
  return iVar11;
}

Assistant:

int MinSum::merge(int *arr, int L, int M, int R) {
        int left_ptr = L,right_ptr = M + 1,tmp_ptr = 0,tmp_arr_len = R - L + 1,res = 0;
        int tmp_arr[tmp_arr_len];

        while (left_ptr <= M && right_ptr <= R){
            res += arr[left_ptr] < arr[right_ptr] ? arr[left_ptr] * (R - right_ptr + 1) : 0;
            tmp_arr[tmp_ptr++] = arr[left_ptr] < arr[right_ptr] ? arr[left_ptr ++] : arr[right_ptr++];
        }

        while (left_ptr <= M)
            tmp_arr[tmp_ptr ++] = arr[left_ptr++];

        while (right_ptr <= R)
            tmp_arr[tmp_ptr++] = arr[right_ptr++];

        for (int i = 0; i < tmp_arr_len; ++i) {
            arr[L + i] = tmp_arr[i];
        }

        return res;
    }